

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_writer_init_v2(mz_zip_archive *pZip,mz_uint64 existing_size,mz_uint flags)

{
  mz_zip_internal_state *pmVar1;
  uint uVar2;
  
  if (pZip != (mz_zip_archive *)0x0) {
    if (((pZip->m_pState == (mz_zip_internal_state *)0x0) &&
        (pZip->m_pWrite != (mz_file_write_func)0x0)) && (pZip->m_zip_mode == MZ_ZIP_MODE_INVALID)) {
      if (((-1 < (short)flags) || (pZip->m_pRead != (mz_file_read_func)0x0)) &&
         ((pZip->m_file_offset_alignment & pZip->m_file_offset_alignment - 1) == 0)) {
        if (pZip->m_pAlloc == (mz_alloc_func)0x0) {
          pZip->m_pAlloc = miniz_def_alloc_func;
        }
        if (pZip->m_pFree == (mz_free_func)0x0) {
          pZip->m_pFree = miniz_def_free_func;
        }
        if (pZip->m_pRealloc == (mz_realloc_func)0x0) {
          pZip->m_pRealloc = miniz_def_realloc_func;
        }
        pZip->m_archive_size = existing_size;
        pZip->m_central_directory_file_ofs = 0;
        pZip->m_total_files = 0;
        pmVar1 = (mz_zip_internal_state *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x98);
        pZip->m_pState = pmVar1;
        if (pmVar1 != (mz_zip_internal_state *)0x0) {
          uVar2 = flags >> 0xe & 1;
          memset(pmVar1,0,0x98);
          pmVar1 = pZip->m_pState;
          (pmVar1->m_central_dir).m_element_size = 1;
          (pmVar1->m_central_dir_offsets).m_element_size = 4;
          (pmVar1->m_sorted_central_dir_offsets).m_element_size = 4;
          pmVar1->m_zip64 = uVar2;
          pmVar1->m_zip64_has_extended_info_fields = uVar2;
          pZip->m_zip_mode = MZ_ZIP_MODE_WRITING;
          pZip->m_zip_type = MZ_ZIP_TYPE_USER;
          return 1;
        }
        pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
        return 0;
      }
    }
    else if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
  }
  return 0;
}

Assistant:

mz_bool mz_zip_writer_init_v2(mz_zip_archive *pZip, mz_uint64 existing_size,
                              mz_uint flags) {
  mz_bool zip64 = (flags & MZ_ZIP_FLAG_WRITE_ZIP64) != 0;

  if ((!pZip) || (pZip->m_pState) || (!pZip->m_pWrite) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_INVALID))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  if (flags & MZ_ZIP_FLAG_WRITE_ALLOW_READING) {
    if (!pZip->m_pRead)
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
  }

  if (pZip->m_file_offset_alignment) {
    /* Ensure user specified file offset alignment is a power of 2. */
    if (pZip->m_file_offset_alignment & (pZip->m_file_offset_alignment - 1))
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
  }

  if (!pZip->m_pAlloc)
    pZip->m_pAlloc = miniz_def_alloc_func;
  if (!pZip->m_pFree)
    pZip->m_pFree = miniz_def_free_func;
  if (!pZip->m_pRealloc)
    pZip->m_pRealloc = miniz_def_realloc_func;

  pZip->m_archive_size = existing_size;
  pZip->m_central_directory_file_ofs = 0;
  pZip->m_total_files = 0;

  if (NULL == (pZip->m_pState = (mz_zip_internal_state *)pZip->m_pAlloc(
                   pZip->m_pAlloc_opaque, 1, sizeof(mz_zip_internal_state))))
    return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

  memset(pZip->m_pState, 0, sizeof(mz_zip_internal_state));

  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_central_dir,
                                sizeof(mz_uint8));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_central_dir_offsets,
                                sizeof(mz_uint32));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_sorted_central_dir_offsets,
                                sizeof(mz_uint32));

  pZip->m_pState->m_zip64 = zip64;
  pZip->m_pState->m_zip64_has_extended_info_fields = zip64;

  pZip->m_zip_type = MZ_ZIP_TYPE_USER;
  pZip->m_zip_mode = MZ_ZIP_MODE_WRITING;

  return MZ_TRUE;
}